

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O1

void __thiscall Fastzip::addDir(Fastzip *this,PathAlias *dirName,PackFormat format)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  string local_48;
  PackFormat local_28;
  int local_24;
  PackFormat format_local;
  int skipLen;
  
  pcVar1 = (dirName->diskPath)._M_pathname._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_28 = format;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (dirName->diskPath)._M_pathname._M_string_length);
  local_24 = 0;
  if ((dirName->aliasTo)._M_string_length == 0) {
    if (this->junkPaths == true) {
      lVar2 = std::__cxx11::string::find_last_of((char *)&local_48,0x13c651,0xffffffffffffffff);
      if (lVar2 != -1) {
        local_24 = (int)lVar2 + 1;
      }
    }
    else {
      uVar3 = (ulong)((uint)(local_48._M_dataplus._M_p[1] == ':') * 2);
      while (((byte)local_48._M_dataplus._M_p[uVar3] - 0x2e < 0x2f &&
             ((0x400000000003U >> ((ulong)((byte)local_48._M_dataplus._M_p[uVar3] - 0x2e) & 0x3f) &
              1) != 0))) {
        uVar3 = uVar3 + 1;
      }
      do {
        uVar4 = uVar3;
        if (local_48._M_dataplus._M_p + uVar4 <= local_48._M_dataplus._M_p) break;
        uVar3 = uVar4 - 1;
      } while (local_48._M_dataplus._M_p[uVar4 - 1] == '.');
      local_24 = (int)uVar4;
    }
  }
  else {
    local_24 = (int)local_48._M_string_length;
  }
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x20);
  *(int **)local_68._M_unused._0_8_ = &local_24;
  *(PackFormat **)((long)local_68._M_unused._0_8_ + 8) = &local_28;
  *(Fastzip **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  *(PathAlias **)((long)local_68._M_unused._0_8_ + 0x18) = dirName;
  pcStack_50 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/fastzip.cpp:313:18)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/fastzip.cpp:313:18)>
             ::_M_manager;
  listFiles(&local_48,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Fastzip::addDir(const PathAlias& dirName, PackFormat format)
{
    const string& d = dirName.diskPath;

    // Set 'skipLen' to the number of chars to strip from the start of each path
    // name
    int skipLen = 0;
    if (dirName.aliasTo.length() > 0) {
        skipLen = d.length();
    } else if (junkPaths) {
        auto last = d.find_last_of("\\/");
        if (last != string::npos)
            skipLen = last + 1;
    } else {
        const char* fn = d.c_str();
        // Skip DOS drive letter
        if (fn[1] == ':')
            fn += 2;

        // Skip path prefixes such as '/' or '../../'
        while (*fn == '/' || *fn == '\\' || *fn == '.')
            fn++;
        while (fn > d.c_str() && fn[-1] == '.')
            fn--;
        skipLen = fn - d.c_str();
    }

    // Recursivly add all files to fileNames
    listFiles(d, [&](const string& path) {
        string target = path.substr(skipLen);
        PackFormat pf = format;

        if (!storeExts.empty()) {
            const char* ext = nullptr;
            auto dot = path.find_last_of('.');
            if (dot != string::npos)
                ext = &path.c_str()[dot + 1];
            if (ext && *ext) {
                for (const auto& se : storeExts) {
                    if (strcmp(se.c_str(), ext) == 0) {
                        pf = UNCOMPRESSED;
                        break;
                    }
                }
            }
        }

        if (dirName.aliasTo.length()) {
            target = dirName.aliasTo + target;
        }
        for (auto& t : target)
            if (t == '\\')
                t = '/';
        strLen += target.length();

        fileNames.emplace_back(path, target, pf);
    });
}